

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void highbd_clamp_epi32_avx2(__m256i *in,__m256i *out,__m256i *clamp_lo,__m256i *clamp_hi,int size)

{
  undefined1 auVar1 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int i;
  __m256i a1;
  __m256i a0;
  undefined4 local_2c4;
  
  for (local_2c4 = 0; local_2c4 < in_R8D; local_2c4 = local_2c4 + 4) {
    auVar1 = vpmaxsd_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_2c4 * 0x20),*in_RDX);
    auVar1 = vpminsd_avx2(auVar1,*in_RCX);
    *(undefined1 (*) [32])(in_RSI + (long)local_2c4 * 0x20) = auVar1;
    auVar1 = vpmaxsd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_2c4 + 1) * 0x20),*in_RDX);
    auVar1 = vpminsd_avx2(auVar1,*in_RCX);
    *(undefined1 (*) [32])(in_RSI + (long)(local_2c4 + 1) * 0x20) = auVar1;
    auVar1 = vpmaxsd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_2c4 + 2) * 0x20),*in_RDX);
    auVar1 = vpminsd_avx2(auVar1,*in_RCX);
    *(undefined1 (*) [32])(in_RSI + (long)(local_2c4 + 2) * 0x20) = auVar1;
    auVar1 = vpmaxsd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_2c4 + 3) * 0x20),*in_RDX);
    auVar1 = vpminsd_avx2(auVar1,*in_RCX);
    *(undefined1 (*) [32])(in_RSI + (long)(local_2c4 + 3) * 0x20) = auVar1;
  }
  return;
}

Assistant:

static void highbd_clamp_epi32_avx2(__m256i *in, __m256i *out,
                                    const __m256i *clamp_lo,
                                    const __m256i *clamp_hi, int size) {
  __m256i a0, a1;
  for (int i = 0; i < size; i += 4) {
    a0 = _mm256_max_epi32(in[i], *clamp_lo);
    out[i] = _mm256_min_epi32(a0, *clamp_hi);

    a1 = _mm256_max_epi32(in[i + 1], *clamp_lo);
    out[i + 1] = _mm256_min_epi32(a1, *clamp_hi);

    a0 = _mm256_max_epi32(in[i + 2], *clamp_lo);
    out[i + 2] = _mm256_min_epi32(a0, *clamp_hi);

    a1 = _mm256_max_epi32(in[i + 3], *clamp_lo);
    out[i + 3] = _mm256_min_epi32(a1, *clamp_hi);
  }
}